

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>::
FunctionMockerBase(FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)> *this)

{
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(&this->super_UntypedFunctionMockerBase);
  (this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0025fdf8;
  (this->current_spec_).function_mocker_ = this;
  (this->current_spec_).matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  value_ = (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->current_spec_).matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
          impl_ + 8))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->current_spec_).matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
               super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.
               super_MatcherBase<int>.impl_ + 8);
  (this->current_spec_).matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0025d418;
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}